

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O0

int parse_port(char *str,uint16_t *ports)

{
  int iVar1;
  uint local_28;
  uint local_24;
  uint32_t max;
  uint32_t min;
  uint16_t *ports_local;
  char *str_local;
  
  local_24 = 0;
  local_28 = 0;
  _max = ports;
  ports_local = (uint16_t *)str;
  iVar1 = __isoc99_sscanf(str,"%u:%u",&local_24,&local_28);
  if (iVar1 < 1) {
    str_local._4_4_ = -1;
  }
  else if ((local_24 == 0) || (0xffff < local_28)) {
    str_local._4_4_ = -1;
  }
  else if ((local_28 == 0) || (local_24 <= local_28)) {
    *_max = (uint16_t)local_24;
    _max[1] = (uint16_t)local_28;
    str_local._4_4_ = 0;
  }
  else {
    str_local._4_4_ = -1;
  }
  return str_local._4_4_;
}

Assistant:

static int parse_port(const char *str, uint16_t *ports)
{
	uint32_t min = 0, max = 0;

	if (sscanf(str, "%u:%u", &min, &max) > 0) {
		if (0 < min && max <= 0xFFFF) {

			if (max > 0 && min > max) {
				return -1;
			}

			ports[0] = (uint16_t)min;
			ports[1] = (uint16_t)max;
		} else {
			return -1;
		}
	} else {
		return -1;
	}

	return 0;
}